

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

int ps_process_cep(ps_decoder_t *ps,float32 **data,int32 n_frames,int no_search,int full_utt)

{
  int iVar1;
  float32 **ppfStack_38;
  int nfr;
  mfcc_t **ptr;
  int n_searchfr;
  int full_utt_local;
  int no_search_local;
  int32 n_frames_local;
  float32 **data_local;
  ps_decoder_t *ps_local;
  
  ptr._0_4_ = 0;
  ppfStack_38 = data;
  ptr._4_4_ = full_utt;
  n_searchfr = no_search;
  full_utt_local = n_frames;
  _no_search_local = data;
  data_local = (float32 **)ps;
  if (no_search != 0) {
    acmod_set_grow(ps->acmod,1);
  }
  while( true ) {
    if (full_utt_local == 0) {
      return (int)ptr;
    }
    iVar1 = acmod_process_cep((acmod_t *)data_local[2],&stack0xffffffffffffffc8,&full_utt_local,
                              ptr._4_4_);
    if (iVar1 < 0) break;
    if (n_searchfr == 0) {
      iVar1 = ps_search_forward((ps_decoder_t *)data_local);
      if (iVar1 < 0) {
        return iVar1;
      }
      ptr._0_4_ = iVar1 + (int)ptr;
    }
  }
  return iVar1;
}

Assistant:

int
ps_process_cep(ps_decoder_t *ps,
               float32 **data,
               int32 n_frames,
               int no_search,
               int full_utt)
{
    int n_searchfr = 0;

#ifdef FIXED_POINT
    mfcc_t **idata, **ptr;
    ptr = idata = ckd_calloc_2d(n_frames,
                                fe_get_output_size(ps->acmod->fe),
                                sizeof(**idata));
    fe_float_to_mfcc(ps->acmod->fe, data, idata, n_frames);
#else
    mfcc_t **ptr = data;
#endif

    if (no_search)
        acmod_set_grow(ps->acmod, TRUE);

    while (n_frames) {
        int nfr;

        /* Process some data into features. */
        if ((nfr = acmod_process_cep(ps->acmod, &ptr,
                                     &n_frames, full_utt)) < 0)
            return nfr;

        /* Score and search as much data as possible */
        if (no_search)
            continue;
        if ((nfr = ps_search_forward(ps)) < 0)
            return nfr;
        n_searchfr += nfr;
    }
#ifdef FIXED_POINT
    ckd_free_2d(idata);
#endif

    return n_searchfr;
}